

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

size_t __thiscall cs222::Instruction::getLength(Instruction *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  Instruction *__nptr;
  bool bVar4;
  int iVar5;
  Type TVar6;
  const_iterator cVar7;
  int *piVar8;
  undefined8 uVar9;
  int *piVar10;
  string op;
  string local_78;
  string local_58;
  Instruction *local_38;
  
  paVar1 = &local_58.field_2;
  pcVar2 = (this->operation)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (this->operation)._M_string_length);
  if (*local_58._M_dataplus._M_p == '+') {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_58);
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = isOperation(&local_58);
  if (bVar4) {
    local_78._M_dataplus._M_p._0_4_ = getFormat(this);
    cVar7 = std::
            _Hashtable<cs222::Instruction::Format,_std::pair<const_cs222::Instruction::Format,_unsigned_long>,_std::allocator<std::pair<const_cs222::Instruction::Format,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<cs222::Instruction::Format>,_std::hash<cs222::Instruction::Format>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<cs222::Instruction::Format,_std::pair<const_cs222::Instruction::Format,_unsigned_long>,_std::allocator<std::pair<const_cs222::Instruction::Format,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<cs222::Instruction::Format>,_std::hash<cs222::Instruction::Format>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)Length,(key_type *)&local_78);
    piVar10 = *(int **)((long)cVar7.
                              super__Node_iterator_base<std::pair<const_cs222::Instruction::Format,_unsigned_long>,_false>
                              ._M_cur + 0x10);
    goto LAB_00122d52;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar5 == 0) {
    piVar10 = (int *)0x3;
    goto LAB_00122d52;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar5 == 0) {
    Operand::getValue_abi_cxx11_(&local_78,&(this->operands).first);
    __nptr = (Instruction *)
             CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p);
    piVar10 = __errno_location();
    iVar5 = *piVar10;
    *piVar10 = 0;
    this = (Instruction *)strtoul((char *)__nptr,(char **)&local_38,10);
    if (local_38 == __nptr) {
      std::__throw_invalid_argument("stoul");
      goto LAB_00122d87;
    }
    if (*piVar10 == 0) {
LAB_00122cba:
      *piVar10 = iVar5;
    }
    else if (*piVar10 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_00122c5d;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
    piVar10 = (int *)((long)this * 3);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar5 == 0) {
        Operand::getValue_abi_cxx11_(&local_78,&(this->operands).first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p
                                  ),local_78.field_2._M_allocated_capacity + 1);
        }
        TVar6 = Operand::getType(&(this->operands).first);
        bVar4 = TVar6 == HEX_CONSTANT;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&this->label);
        if (iVar5 != 0) {
          piVar10 = (int *)0x0;
          goto LAB_00122d52;
        }
        sVar3 = (this->operation)._M_string_length;
        TVar6 = Operand::getType(&(this->operands).first);
        bVar4 = TVar6 == HEX_LITERAL;
        local_78._M_string_length = sVar3;
      }
      piVar10 = (int *)(local_78._M_string_length >> bVar4);
      goto LAB_00122d52;
    }
LAB_00122c5d:
    Operand::getValue_abi_cxx11_(&local_78,&(this->operands).first);
    this = (Instruction *)
           CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p);
    piVar8 = __errno_location();
    iVar5 = *piVar8;
    *piVar8 = 0;
    piVar10 = (int *)strtoul((char *)this,(char **)&local_38,10);
    if (local_38 == this) {
LAB_00122d87:
      uVar9 = std::__throw_invalid_argument("stoul");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar9);
    }
    if (*piVar8 == 0) {
      *piVar8 = iVar5;
    }
    else if (*piVar8 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_00122cba;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Format)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00122d52:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (size_t)piVar10;
}

Assistant:

size_t Instruction::getLength() const
    {
        size_t length = 0;
        std::string op = operation;
        if (op[0] == '+')
            op = op.substr(1);

        if (isOperation(op))
        {
            length = Length.find(getFormat())->second;
        }
        else if (op == DIR_WORD)
        {
            length = 3;
        }
        else if (op == DIR_RESW)
        {
            length = 3 * std::stoul(operands.first.getValue());
        }
        else if (op == DIR_RESB)
        {
            length = std::stoul(operands.first.getValue());
        }
        else if (op == DIR_BYTE)
        {
            length = operands.first.getValue().length();
            if (operands.first.getType() == Operand::HEX_CONSTANT)
            {
                length /= 2;
            }
        }
        else if (label == "*") {
            length = operation.length();
            if (operands.first.getType() == Operand::HEX_LITERAL)
            {
                length /= 2;
            }
        }

        return length;
    }